

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asListAnySize(ListBuilder *__return_storage_ptr__,OrphanBuilder *this)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  SegmentId id;
  CapTableBuilder *pCVar3;
  uint64_t *puVar4;
  uint uVar5;
  int iVar6;
  SegmentBuilder *this_00;
  word *pwVar7;
  StructDataBitCount SVar8;
  ushort uVar9;
  ulong uVar10;
  ElementSize EVar11;
  BitsPerElementN<23> BVar12;
  OrphanBuilder *pOVar13;
  Fault f;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  
  uVar5 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  if (id.value != 0 || uVar5 != 0) {
    this_00 = this->segment;
    pCVar3 = this->capTable;
    if ((uVar5 & 3) == 2) {
      this_00 = BuilderArena::getSegment((BuilderArena *)(this_00->super_SegmentReader).arena,id);
      uVar5 = (uint)(this->tag).content;
      pwVar7 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar5 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar7->content + uVar10);
      pOVar13 = (OrphanBuilder *)((long)&pwVar7[1].content + uVar10);
      if ((uVar5 & 4) == 0) {
        pwVar7 = &pOVar13->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar13 = pOVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar7 = (word *)((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                         (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar7 = this->location;
      pOVar13 = this;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (Kind)(pOVar13->tag).content & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.result) {
      uVar5 = *(uint *)((long)&(pOVar13->tag).content + 4);
      EVar11 = (ElementSize)uVar5 & INLINE_COMPOSITE;
      if (EVar11 == INLINE_COMPOSITE) {
        _kjCondition.left = (Kind)pwVar7->content & OTHER;
        _kjCondition.result = _kjCondition.left == STRUCT;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x58c,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&f);
        }
        uVar2 = *(ushort *)((long)&pwVar7->content + 4);
        uVar9 = *(ushort *)((long)&pwVar7->content + 6);
        puVar4 = &pwVar7->content;
        pwVar7 = pwVar7 + 1;
        BVar12 = ((uint)uVar9 + (uint)uVar2) * 0x40;
        uVar5 = (uint)*puVar4 >> 2 & 0x1fffffff;
        SVar8 = (uint)uVar2 << 6;
        EVar11 = INLINE_COMPOSITE;
      }
      else {
        SVar8 = (&BITS_PER_ELEMENT_TABLE)[EVar11];
        uVar9 = (ushort)(EVar11 == POINTER);
        BVar12 = (uint)(EVar11 == POINTER) * 0x40 + SVar8;
        uVar5 = uVar5 >> 3;
      }
      __return_storage_ptr__->segment = this_00;
      __return_storage_ptr__->capTable = pCVar3;
      __return_storage_ptr__->ptr = (byte *)pwVar7;
      __return_storage_ptr__->elementCount = uVar5;
      __return_storage_ptr__->step = BVar12;
      __return_storage_ptr__->structDataSize = SVar8;
      __return_storage_ptr__->structPointerCount = uVar9;
      __return_storage_ptr__->elementSize = EVar11;
      iVar6 = 1;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[92]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x582,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [92])
                 "Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar6 = 2;
    }
    if (iVar6 != 2) goto LAB_00370bb2;
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
LAB_00370bb2:
  if ((__return_storage_ptr__->elementSize == INLINE_COMPOSITE) &&
     (__return_storage_ptr__->ptr != (byte *)0x0)) {
    pwVar7 = (word *)(__return_storage_ptr__->ptr + -8);
  }
  else {
    pwVar7 = (word *)__return_storage_ptr__->ptr;
  }
  this->location = pwVar7;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asListAnySize() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointerAnySize(
      tagAsPtr(), location, segment, capTable, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}